

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::TempVar::freeIdx(TempVar *this)

{
  I64ToI32Lowering *pIVar1;
  bool bVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  uint *local_38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  BasicType local_1c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  mapped_type *freeList;
  TempVar *this_local;
  
  pIVar1 = this->pass;
  freeList = (mapped_type *)this;
  local_1c = wasm::Type::getBasic(&this->ty);
  local_18 = std::
             unordered_map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&pIVar1->freeTemps,(key_type *)&local_1c);
  local_30._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(local_18);
  local_38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(local_18);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                       (local_30,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  )local_38,&this->idx);
  local_40._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(local_18);
  bVar2 = __gnu_cxx::operator==(&local_28,&local_40);
  if (!bVar2) {
    __assert_fail("std::find(freeList.begin(), freeList.end(), idx) == freeList.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                  ,0x58,"void wasm::I64ToI32Lowering::TempVar::freeIdx()");
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_18,&this->idx);
  return;
}

Assistant:

void freeIdx() {
      auto& freeList = pass.freeTemps[ty.getBasic()];
      assert(std::find(freeList.begin(), freeList.end(), idx) ==
             freeList.end());
      freeList.push_back(idx);
    }